

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<Level> __l;
  Option *this;
  ParseError *e;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator<Level> local_296;
  less<Level> local_295;
  Level local_294 [3];
  iterator local_288;
  size_type local_280;
  set<Level,_std::less<Level>,_std::allocator<Level>_> local_278;
  allocator local_241;
  string local_240;
  Level local_220 [2];
  Level level;
  allocator local_209;
  string local_208;
  undefined1 local_1e8 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_ptr_ = (Option *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"",&local_209);
  CLI::App::App((App *)local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"-l,--level",&local_241);
  local_294[0] = High;
  local_294[1] = 1;
  local_294[2] = 2;
  local_288 = local_294;
  local_280 = 3;
  CLI::std::allocator<Level>::allocator(&local_296);
  __l._M_len = local_280;
  __l._M_array = local_288;
  CLI::std::set<Level,_std::less<Level>,_std::allocator<Level>_>::set
            (&local_278,__l,&local_295,&local_296);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"Level settings",&local_2b9);
  this = CLI::App::add_set<Level>((App *)local_1e8,&local_240,local_220,&local_278,&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2e0,"enum/Level in {High=0, Medium=1, Low=2}",
             (allocator *)((long)&e + 7));
  CLI::Option::set_type_name(this,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  CLI::std::set<Level,_std::less<Level>,_std::allocator<Level>_>::~set(&local_278);
  CLI::std::allocator<Level>::~allocator(&local_296);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  CLI::App::parse((App *)local_1e8,argc,(char **)app.config_ptr_);
  CLI::App::~App((App *)local_1e8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;

    Level level;
    app.add_set("-l,--level", level, {High, Medium, Low}, "Level settings")
        ->set_type_name("enum/Level in {High=0, Medium=1, Low=2}");

    CLI11_PARSE(app, argc, argv);

    return 0;
}